

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O2

void visit_keys(node_t node_,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_,
               _func_void_uchar_ptr_size_t_void_ptr *func_,void *arg_)

{
  uint uVar1;
  node_t node__00;
  pointer puVar2;
  pointer puVar3;
  size_t index_;
  ulong uVar4;
  node_t local_38;
  
  uVar4 = (ulong)*(uint *)(node_._data + 4);
  local_38._data = node_._data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (buffer_,(size_type)
                     ((buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish +
                     (uVar4 - (long)(buffer_->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start)));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (node_._data + 0xc,node_._data + uVar4 + 0xc,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             buffer_);
  if (*(int *)node_._data != 0) {
    puVar3 = (buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar3 == puVar2) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!buffer_.empty ()",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
              ,0x22a);
      fflush(_stderr);
      zmq::zmq_abort("!buffer_.empty ()");
      puVar3 = (buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (buffer_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    (*func_)(puVar3,(long)puVar2 - (long)puVar3,arg_);
  }
  uVar1 = *(uint *)(node_._data + 8);
  for (index_ = 0; uVar1 != index_; index_ = index_ + 1) {
    node__00 = node_t::node_at(&local_38,index_);
    visit_keys(node__00,buffer_,func_,arg_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (buffer_,(long)(buffer_->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)((buffer_->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar4));
  return;
}

Assistant:

static void
visit_keys (node_t node_,
            std::vector<unsigned char> &buffer_,
            void (*func_) (unsigned char *data_, size_t size_, void *arg_),
            void *arg_)
{
    const size_t prefix_length = node_.prefix_length ();
    buffer_.reserve (buffer_.size () + prefix_length);
    std::copy (node_.prefix (), node_.prefix () + prefix_length,
               std::back_inserter (buffer_));

    if (node_.refcount () > 0) {
        zmq_assert (!buffer_.empty ());
        func_ (&buffer_[0], buffer_.size (), arg_);
    }

    for (size_t i = 0, edgecount = node_.edgecount (); i < edgecount; ++i) {
        visit_keys (node_.node_at (i), buffer_, func_, arg_);
    }
    buffer_.resize (buffer_.size () - prefix_length);
}